

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O1

LBBox3fa * __thiscall
embree::avx512::GridMeshISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,GridMeshISA *this,size_t buildID,BBox1f *time_range,
          SubGridBuildData *sgrids)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  int iVar9;
  int iVar10;
  undefined1 (*pauVar11) [16];
  int iVar12;
  int iVar13;
  ushort uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ushort uVar20;
  ulong uVar21;
  ulong uVar22;
  BufferView<embree::Vec3fa> *pBVar23;
  ulong uVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM18 [16];
  
  uVar21 = (ulong)sgrids[buildID].sx & 0x7fff;
  uVar15 = (ulong)sgrids[buildID].sy & 0x7fff;
  lVar19 = (ulong)sgrids[buildID].primID * *(long *)&(this->super_GridMesh).field_0x68;
  fVar1 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
  fVar34 = (this->super_GridMesh).super_Geometry.time_range.lower;
  lVar4 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
  fVar45 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar34;
  fVar39 = (time_range->lower - fVar34) / fVar45;
  fVar45 = (time_range->upper - fVar34) / fVar45;
  fVar34 = fVar1 * fVar39;
  fVar46 = fVar1 * fVar45;
  auVar33 = vroundss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),9);
  auVar43 = vroundss_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46),10);
  auVar26._0_12_ = ZEXT812(0);
  auVar26._12_4_ = 0;
  auVar26 = vmaxss_avx(auVar33,auVar26);
  auVar28 = vminss_avx(auVar43,ZEXT416((uint)fVar1));
  fVar53 = auVar26._0_4_;
  iVar9 = (int)fVar53;
  iVar12 = -1;
  if (-1 < (int)auVar33._0_4_) {
    iVar12 = (int)auVar33._0_4_;
  }
  iVar13 = (int)fVar1 + 1;
  if ((int)auVar43._0_4_ < (int)fVar1 + 1) {
    iVar13 = (int)auVar43._0_4_;
  }
  uVar2 = *(ushort *)(lVar4 + 10 + lVar19);
  uVar22 = (ulong)uVar2;
  if (uVar15 + 3 < (ulong)uVar2) {
    uVar22 = uVar15 + 3;
  }
  auVar31._8_4_ = 0xff800000;
  auVar31._0_8_ = 0xff800000ff800000;
  auVar31._12_4_ = 0xff800000;
  auVar32._8_4_ = 0x7f800000;
  auVar32._0_8_ = 0x7f8000007f800000;
  auVar32._12_4_ = 0x7f800000;
  uVar14 = (ushort)uVar15;
  uVar20 = (ushort)uVar21;
  auVar33 = auVar31;
  auVar43 = auVar32;
  if (uVar14 < uVar2) {
    uVar3 = *(ushort *)(lVar4 + 8 + lVar19);
    uVar17 = (ulong)uVar3;
    if (uVar21 + 3 < (ulong)uVar3) {
      uVar17 = uVar21 + 3;
    }
    pBVar23 = (this->super_GridMesh).vertices.items + iVar9;
    auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar41 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
    bVar25 = true;
    auVar27._8_4_ = 0xddccb9a2;
    auVar27._0_8_ = 0xddccb9a2ddccb9a2;
    auVar27._12_4_ = 0xddccb9a2;
    auVar59._8_4_ = 0x5dccb9a2;
    auVar59._0_8_ = 0x5dccb9a25dccb9a2;
    auVar59._12_4_ = 0x5dccb9a2;
    uVar24 = uVar15;
    do {
      if (uVar20 < uVar3) {
        sVar5 = (pBVar23->super_RawBufferView).stride;
        pauVar11 = (undefined1 (*) [16])
                   ((pBVar23->super_RawBufferView).ptr_ofs +
                   (*(uint *)(lVar4 + lVar19) + uVar21 + *(uint *)(lVar4 + 4 + lVar19) * uVar24) *
                   sVar5);
        lVar18 = uVar17 - uVar21;
        do {
          auVar43 = auVar44._0_16_;
          auVar33 = auVar41._0_16_;
          auVar26 = *pauVar11;
          uVar6 = vcmpps_avx512vl(auVar26,auVar27,6);
          uVar7 = vcmpps_avx512vl(auVar26,auVar59,1);
          if ((~((ushort)uVar6 & (ushort)uVar7) & 7) != 0) {
            if (bVar25) {
              auVar43._8_4_ = 0x7f800000;
              auVar43._0_8_ = 0x7f8000007f800000;
              auVar43._12_4_ = 0x7f800000;
              auVar33._8_4_ = 0xff800000;
              auVar33._0_8_ = 0xff800000ff800000;
              auVar33._12_4_ = 0xff800000;
            }
            goto LAB_01fb44a1;
          }
          auVar43 = vminps_avx(auVar43,auVar26);
          auVar44 = ZEXT1664(auVar43);
          auVar26 = vmaxps_avx(auVar33,auVar26);
          auVar41 = ZEXT1664(auVar26);
          pauVar11 = (undefined1 (*) [16])(*pauVar11 + sVar5);
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      auVar43 = auVar44._0_16_;
      auVar33 = auVar41._0_16_;
      uVar24 = uVar24 + 1;
      bVar25 = uVar24 < uVar22;
    } while (uVar24 != uVar22);
  }
LAB_01fb44a1:
  fVar49 = auVar28._0_4_;
  iVar10 = (int)fVar49;
  if (uVar14 < uVar2) {
    uVar3 = *(ushort *)(lVar4 + 8 + lVar19);
    uVar17 = (ulong)uVar3;
    if (uVar21 + 3 < (ulong)uVar3) {
      uVar17 = uVar21 + 3;
    }
    pBVar23 = (this->super_GridMesh).vertices.items + iVar10;
    auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar41 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
    bVar25 = true;
    auVar28._8_4_ = 0xddccb9a2;
    auVar28._0_8_ = 0xddccb9a2ddccb9a2;
    auVar28._12_4_ = 0xddccb9a2;
    auVar60._8_4_ = 0x5dccb9a2;
    auVar60._0_8_ = 0x5dccb9a25dccb9a2;
    auVar60._12_4_ = 0x5dccb9a2;
    uVar24 = uVar15;
    do {
      if (uVar20 < uVar3) {
        sVar5 = (pBVar23->super_RawBufferView).stride;
        pauVar11 = (undefined1 (*) [16])
                   ((pBVar23->super_RawBufferView).ptr_ofs +
                   (*(uint *)(lVar4 + lVar19) + uVar21 + *(uint *)(lVar4 + 4 + lVar19) * uVar24) *
                   sVar5);
        lVar18 = uVar17 - uVar21;
        do {
          auVar32 = auVar44._0_16_;
          auVar31 = auVar41._0_16_;
          auVar26 = *pauVar11;
          uVar6 = vcmpps_avx512vl(auVar26,auVar28,6);
          uVar7 = vcmpps_avx512vl(auVar26,auVar60,1);
          if ((~((ushort)uVar6 & (ushort)uVar7) & 7) != 0) {
            if (bVar25) {
              auVar32._8_4_ = 0x7f800000;
              auVar32._0_8_ = 0x7f8000007f800000;
              auVar32._12_4_ = 0x7f800000;
              auVar31._8_4_ = 0xff800000;
              auVar31._0_8_ = 0xff800000ff800000;
              auVar31._12_4_ = 0xff800000;
            }
            goto LAB_01fb4576;
          }
          auVar32 = vminps_avx(auVar32,auVar26);
          auVar44 = ZEXT1664(auVar32);
          auVar26 = vmaxps_avx(auVar31,auVar26);
          auVar41 = ZEXT1664(auVar26);
          pauVar11 = (undefined1 (*) [16])(*pauVar11 + sVar5);
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      auVar31 = auVar41._0_16_;
      auVar32 = auVar44._0_16_;
      uVar24 = uVar24 + 1;
      bVar25 = uVar24 < uVar22;
    } while (uVar24 != uVar22);
  }
LAB_01fb4576:
  if (iVar13 - iVar12 == 1) {
    auVar26 = vmaxss_avx(ZEXT416((uint)(fVar34 - fVar53)),ZEXT816(0));
    fVar34 = auVar26._0_4_;
    fVar1 = 1.0 - fVar34;
    auVar54._0_4_ = fVar34 * auVar32._0_4_;
    auVar54._4_4_ = fVar34 * auVar32._4_4_;
    auVar54._8_4_ = fVar34 * auVar32._8_4_;
    auVar54._12_4_ = fVar34 * auVar32._12_4_;
    auVar52._4_4_ = fVar1;
    auVar52._0_4_ = fVar1;
    auVar52._8_4_ = fVar1;
    auVar52._12_4_ = fVar1;
    aVar38 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar54,auVar52,auVar43);
    auVar35._0_4_ = fVar34 * auVar31._0_4_;
    auVar35._4_4_ = fVar34 * auVar31._4_4_;
    auVar35._8_4_ = fVar34 * auVar31._8_4_;
    auVar35._12_4_ = fVar34 * auVar31._12_4_;
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar38;
    aVar38 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar35,auVar33,auVar52);
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar38;
    auVar26 = vmaxss_avx(ZEXT416((uint)(fVar49 - fVar46)),ZEXT816(0));
    fVar34 = auVar26._0_4_;
    fVar1 = 1.0 - fVar34;
    auVar42._0_4_ = fVar34 * auVar43._0_4_;
    auVar42._4_4_ = fVar34 * auVar43._4_4_;
    auVar42._8_4_ = fVar34 * auVar43._8_4_;
    auVar42._12_4_ = fVar34 * auVar43._12_4_;
    auVar40._4_4_ = fVar1;
    auVar40._0_4_ = fVar1;
    auVar40._8_4_ = fVar1;
    auVar40._12_4_ = fVar1;
    aVar38 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar32,auVar40,auVar42);
    auVar36._0_4_ = fVar34 * auVar33._0_4_;
    auVar36._4_4_ = fVar34 * auVar33._4_4_;
    auVar36._8_4_ = fVar34 * auVar33._8_4_;
    auVar36._12_4_ = fVar34 * auVar33._12_4_;
    aVar37 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar31,auVar40,auVar36);
  }
  else {
    auVar57._8_4_ = 0xff800000;
    auVar57._0_8_ = 0xff800000ff800000;
    auVar57._12_4_ = 0xff800000;
    auVar61._8_4_ = 0x7f800000;
    auVar61._0_8_ = 0x7f8000007f800000;
    auVar61._12_4_ = 0x7f800000;
    auVar65 = auVar61;
    auVar63 = auVar57;
    if (uVar14 < uVar2) {
      uVar3 = *(ushort *)(lVar4 + 8 + lVar19);
      uVar17 = (ulong)uVar3;
      if (uVar21 + 3 < (ulong)uVar3) {
        uVar17 = uVar21 + 3;
      }
      pBVar23 = (this->super_GridMesh).vertices.items;
      auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar41 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      bVar25 = true;
      auVar66._8_4_ = 0xddccb9a2;
      auVar66._0_8_ = 0xddccb9a2ddccb9a2;
      auVar66._12_4_ = 0xddccb9a2;
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
      uVar24 = uVar15;
      do {
        if (uVar20 < uVar3) {
          sVar5 = pBVar23[(long)iVar9 + 1].super_RawBufferView.stride;
          pauVar11 = (undefined1 (*) [16])
                     (pBVar23[(long)iVar9 + 1].super_RawBufferView.ptr_ofs +
                     (*(uint *)(lVar4 + lVar19) + uVar21 + *(uint *)(lVar4 + 4 + lVar19) * uVar24) *
                     sVar5);
          lVar18 = uVar17 - uVar21;
          do {
            auVar65 = auVar44._0_16_;
            auVar63 = auVar41._0_16_;
            auVar28 = *pauVar11;
            uVar6 = vcmpps_avx512vl(auVar28,auVar66,6);
            uVar7 = vcmpps_avx512vl(auVar28,auVar26,1);
            if ((~((ushort)uVar6 & (ushort)uVar7) & 7) != 0) {
              if (bVar25) {
                auVar65._8_4_ = 0x7f800000;
                auVar65._0_8_ = 0x7f8000007f800000;
                auVar65._12_4_ = 0x7f800000;
                auVar63._8_4_ = 0xff800000;
                auVar63._0_8_ = 0xff800000ff800000;
                auVar63._12_4_ = 0xff800000;
              }
              goto LAB_01fb46dd;
            }
            auVar27 = vminps_avx512vl(auVar65,auVar28);
            auVar44 = ZEXT1664(auVar27);
            auVar28 = vmaxps_avx512vl(auVar63,auVar28);
            auVar41 = ZEXT1664(auVar28);
            pauVar11 = (undefined1 (*) [16])(*pauVar11 + sVar5);
            lVar18 = lVar18 + -1;
          } while (lVar18 != 0);
        }
        auVar63 = auVar41._0_16_;
        auVar65 = auVar44._0_16_;
        uVar24 = uVar24 + 1;
        bVar25 = uVar24 < uVar22;
      } while (uVar24 != uVar22);
    }
LAB_01fb46dd:
    if (uVar14 < uVar2) {
      uVar3 = *(ushort *)(lVar4 + 8 + lVar19);
      uVar17 = (ulong)uVar3;
      if (uVar21 + 3 < (ulong)uVar3) {
        uVar17 = uVar21 + 3;
      }
      pBVar23 = (this->super_GridMesh).vertices.items;
      auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar41 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      bVar25 = true;
      auVar67._8_4_ = 0xddccb9a2;
      auVar67._0_8_ = 0xddccb9a2ddccb9a2;
      auVar67._12_4_ = 0xddccb9a2;
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
      uVar24 = uVar15;
      do {
        if (uVar20 < uVar3) {
          sVar5 = pBVar23[(long)iVar10 + -1].super_RawBufferView.stride;
          pauVar11 = (undefined1 (*) [16])
                     (pBVar23[(long)iVar10 + -1].super_RawBufferView.ptr_ofs +
                     (*(uint *)(lVar4 + lVar19) + uVar21 + *(uint *)(lVar4 + 4 + lVar19) * uVar24) *
                     sVar5);
          lVar18 = uVar17 - uVar21;
          do {
            auVar61 = auVar44._0_16_;
            auVar57 = auVar41._0_16_;
            auVar28 = *pauVar11;
            uVar6 = vcmpps_avx512vl(auVar28,auVar67,6);
            uVar7 = vcmpps_avx512vl(auVar28,auVar26,1);
            if ((~((ushort)uVar6 & (ushort)uVar7) & 7) != 0) {
              if (bVar25) {
                auVar61._8_4_ = 0x7f800000;
                auVar61._0_8_ = 0x7f8000007f800000;
                auVar61._12_4_ = 0x7f800000;
                auVar57._8_4_ = 0xff800000;
                auVar57._0_8_ = 0xff800000ff800000;
                auVar57._12_4_ = 0xff800000;
              }
              goto LAB_01fb47ae;
            }
            auVar27 = vminps_avx512vl(auVar61,auVar28);
            auVar44 = ZEXT1664(auVar27);
            auVar28 = vmaxps_avx512vl(auVar57,auVar28);
            auVar41 = ZEXT1664(auVar28);
            pauVar11 = (undefined1 (*) [16])(*pauVar11 + sVar5);
            lVar18 = lVar18 + -1;
          } while (lVar18 != 0);
        }
        auVar57 = auVar41._0_16_;
        auVar61 = auVar44._0_16_;
        uVar24 = uVar24 + 1;
        bVar25 = uVar24 < uVar22;
      } while (uVar24 != uVar22);
    }
LAB_01fb47ae:
    auVar26 = vmaxss_avx(ZEXT416((uint)(fVar34 - fVar53)),ZEXT816(0) << 0x20);
    auVar28 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar26);
    fVar34 = auVar26._0_4_;
    auVar64._0_4_ = fVar34 * auVar65._0_4_;
    auVar64._4_4_ = fVar34 * auVar65._4_4_;
    auVar64._8_4_ = fVar34 * auVar65._8_4_;
    auVar64._12_4_ = fVar34 * auVar65._12_4_;
    auVar26 = vbroadcastss_avx512vl(auVar28);
    auVar29 = vfmadd213ps_avx512vl(auVar43,auVar26,auVar64);
    auVar62._0_4_ = fVar34 * auVar63._0_4_;
    auVar62._4_4_ = fVar34 * auVar63._4_4_;
    auVar62._8_4_ = fVar34 * auVar63._8_4_;
    auVar62._12_4_ = fVar34 * auVar63._12_4_;
    auVar30 = vfmadd213ps_avx512vl(auVar33,auVar26,auVar62);
    auVar26 = vmaxss_avx(ZEXT416((uint)(fVar49 - fVar46)),ZEXT816(0) << 0x20);
    fVar46 = auVar26._0_4_;
    fVar34 = 1.0 - fVar46;
    auVar55._0_4_ = auVar61._0_4_ * fVar46;
    auVar55._4_4_ = auVar61._4_4_ * fVar46;
    auVar55._8_4_ = auVar61._8_4_ * fVar46;
    auVar55._12_4_ = auVar61._12_4_ * fVar46;
    auVar50._4_4_ = fVar34;
    auVar50._0_4_ = fVar34;
    auVar50._8_4_ = fVar34;
    auVar50._12_4_ = fVar34;
    aVar38 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar32,auVar50,auVar55);
    auVar47._0_4_ = auVar57._0_4_ * fVar46;
    auVar47._4_4_ = auVar57._4_4_ * fVar46;
    auVar47._8_4_ = auVar57._8_4_ * fVar46;
    auVar47._12_4_ = auVar57._12_4_ * fVar46;
    aVar37 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar31,auVar50,auVar47);
    if ((int)(iVar12 + 1U) < iVar13) {
      uVar17 = (ulong)(iVar12 + 1U);
      auVar48._8_4_ = 0x7f800000;
      auVar48._0_8_ = 0x7f8000007f800000;
      auVar48._12_4_ = 0x7f800000;
      auVar51._8_4_ = 0xff800000;
      auVar51._0_8_ = 0xff800000ff800000;
      auVar51._12_4_ = 0xff800000;
      auVar56._8_4_ = 0xddccb9a2;
      auVar56._0_8_ = 0xddccb9a2ddccb9a2;
      auVar56._12_4_ = 0xddccb9a2;
      auVar58._8_4_ = 0x5dccb9a2;
      auVar58._0_8_ = 0x5dccb9a25dccb9a2;
      auVar58._12_4_ = 0x5dccb9a2;
      auVar26 = auVar30;
      auVar28 = auVar29;
      aVar8 = aVar38;
      do {
        auVar33 = auVar48;
        auVar43 = auVar51;
        if (uVar14 < uVar2) {
          uVar3 = *(ushort *)(lVar4 + 8 + lVar19);
          uVar24 = (ulong)uVar3;
          if (uVar21 + 3 < (ulong)uVar3) {
            uVar24 = uVar21 + 3;
          }
          pBVar23 = (this->super_GridMesh).vertices.items + uVar17;
          bVar25 = true;
          auVar41 = ZEXT1664(auVar51);
          auVar44 = ZEXT1664(auVar48);
          uVar16 = uVar15;
          do {
            if (uVar20 < uVar3) {
              sVar5 = (pBVar23->super_RawBufferView).stride;
              pauVar11 = (undefined1 (*) [16])
                         ((pBVar23->super_RawBufferView).ptr_ofs +
                         (*(uint *)(lVar4 + lVar19) + uVar21 +
                         *(uint *)(lVar4 + 4 + lVar19) * uVar16) * sVar5);
              lVar18 = uVar24 - uVar21;
              do {
                auVar33 = *pauVar11;
                uVar6 = vcmpps_avx512vl(auVar33,auVar56,6);
                uVar7 = vcmpps_avx512vl(auVar33,auVar58,1);
                if ((~((ushort)uVar6 & (ushort)uVar7) & 7) != 0) {
                  auVar33 = auVar48;
                  auVar43 = auVar51;
                  if (!bVar25) {
                    auVar33 = auVar44._0_16_;
                    auVar43 = auVar41._0_16_;
                  }
                  goto LAB_01fb4949;
                }
                auVar43 = vminps_avx(auVar44._0_16_,auVar33);
                auVar44 = ZEXT1664(auVar43);
                auVar33 = vmaxps_avx(auVar41._0_16_,auVar33);
                auVar41 = ZEXT1664(auVar33);
                pauVar11 = (undefined1 (*) [16])(*pauVar11 + sVar5);
                lVar18 = lVar18 + -1;
              } while (lVar18 != 0);
            }
            auVar43 = auVar41._0_16_;
            auVar33 = auVar44._0_16_;
            uVar16 = uVar16 + 1;
            bVar25 = uVar16 < uVar22;
          } while (uVar16 != uVar22);
        }
LAB_01fb4949:
        auVar31 = vcvtsi2ss_avx512f(in_XMM18,(int)uVar17);
        auVar68._0_4_ = (auVar31._0_4_ / fVar1 - fVar39) / (fVar45 - fVar39);
        auVar68._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar31 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar68);
        auVar69._4_4_ = auVar68._0_4_;
        auVar69._0_4_ = auVar68._0_4_;
        auVar69._8_4_ = auVar68._0_4_;
        auVar69._12_4_ = auVar68._0_4_;
        auVar32 = vmulps_avx512vl((undefined1  [16])aVar8,auVar69);
        auVar31 = vbroadcastss_avx512vl(auVar31);
        auVar32 = vfmadd231ps_avx512vl(auVar32,auVar31,auVar28);
        auVar32 = vsubps_avx512vl(auVar33,auVar32);
        auVar70._0_4_ = auVar68._0_4_ * aVar37.m128[0];
        fVar34 = aVar37.m128[1];
        auVar70._4_4_ = auVar68._0_4_ * fVar34;
        fVar46 = aVar37.m128[2];
        auVar70._8_4_ = auVar68._0_4_ * fVar46;
        fVar53 = aVar37.m128[3];
        auVar70._12_4_ = auVar68._0_4_ * fVar53;
        auVar33 = vfmadd231ps_avx512vl(auVar70,auVar26,auVar31);
        auVar33 = vsubps_avx(auVar43,auVar33);
        auVar43 = vminps_avx(auVar32,ZEXT816(0) << 0x40);
        auVar33 = vmaxps_avx(auVar33,ZEXT816(0) << 0x40);
        auVar29._0_4_ = auVar43._0_4_ + auVar28._0_4_;
        auVar29._4_4_ = auVar43._4_4_ + auVar28._4_4_;
        auVar29._8_4_ = auVar43._8_4_ + auVar28._8_4_;
        auVar29._12_4_ = auVar43._12_4_ + auVar28._12_4_;
        aVar38._0_4_ = auVar43._0_4_ + aVar8.m128[0];
        aVar38._4_4_ = auVar43._4_4_ + aVar8.m128[1];
        aVar38._8_4_ = auVar43._8_4_ + aVar8.m128[2];
        aVar38._12_4_ = auVar43._12_4_ + aVar8.m128[3];
        auVar30._0_4_ = auVar33._0_4_ + auVar26._0_4_;
        auVar30._4_4_ = auVar33._4_4_ + auVar26._4_4_;
        auVar30._8_4_ = auVar33._8_4_ + auVar26._8_4_;
        auVar30._12_4_ = auVar33._12_4_ + auVar26._12_4_;
        aVar37._0_4_ = auVar33._0_4_ + aVar37.m128[0];
        aVar37._4_4_ = auVar33._4_4_ + fVar34;
        aVar37._8_4_ = auVar33._8_4_ + fVar46;
        aVar37._12_4_ = auVar33._12_4_ + fVar53;
        uVar17 = uVar17 + 1;
        auVar26 = auVar30;
        auVar28 = auVar29;
        aVar8 = aVar38;
      } while (iVar13 != (int)uVar17);
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar29;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar30;
  }
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar38;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar37;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t buildID, const BBox1f& time_range, const SubGridBuildData * const sgrids) const override {
        const SubGridBuildData &subgrid = sgrids[buildID];                      
        const unsigned int primID = subgrid.primID;
        const size_t x = subgrid.x();
        const size_t y = subgrid.y();
        return linearBounds(grid(primID),x,y,time_range);
      }